

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi.cpp
# Opt level: O0

void opn2_setScaleModulators(OPN2_MIDIPlayer *device,int smod)

{
  int iVar1;
  void *pvVar2;
  OPN2 *pOVar3;
  MidiPlayer *play;
  int smod_local;
  OPN2_MIDIPlayer *device_local;
  
  if (device != (OPN2_MIDIPlayer *)0x0) {
    pvVar2 = device->opn2_midiPlayer;
    if (pvVar2 == (void *)0x0) {
      __assert_fail("play",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libOPNMIDI/src/opnmidi.cpp"
                    ,0x176,"void opn2_setScaleModulators(OPN2_MIDIPlayer *, int)");
    }
    *(int *)((long)pvVar2 + 0x11bc) = smod;
    iVar1 = *(int *)((long)pvVar2 + 0x11bc);
    pOVar3 = AdlMIDI_UPtr<OPN2,_ADLMIDI_DefaultDelete<OPN2>_>::operator->
                       ((AdlMIDI_UPtr<OPN2,_ADLMIDI_DefaultDelete<OPN2>_> *)((long)pvVar2 + 400));
    pOVar3->m_scaleModulators = iVar1 != 0;
  }
  return;
}

Assistant:

OPNMIDI_EXPORT void opn2_setScaleModulators(OPN2_MIDIPlayer *device, int smod)
{
    if(!device)
        return;
    MidiPlayer *play = GET_MIDI_PLAYER(device);
    assert(play);
    play->m_setup.ScaleModulators = smod;
    play->m_synth->m_scaleModulators = (play->m_setup.ScaleModulators != 0);
}